

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

void __thiscall arangodb::velocypack::Parser::Parser(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  Builder *pBVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_29;
  Builder *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  (this->_builder).super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->_builder).super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_start = (uint8_t *)0x0;
  this->_size = 0;
  *(undefined8 *)((long)&this->_size + 4) = 0;
  *(undefined8 *)((long)&this->_pos + 4) = 0;
  this->options = &Options::Defaults;
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<arangodb::velocypack::Builder,std::allocator<arangodb::velocypack::Builder>>
            (a_Stack_20,&local_28,(allocator<arangodb::velocypack::Builder> *)&local_29);
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  pBVar2 = local_28;
  local_28 = (Builder *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->_builder).
            super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->_builder).super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pBVar2;
  (this->_builder).super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  peVar1 = (this->_builder).
           super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this->_builderPtr = peVar1;
  peVar1->options = &Options::Defaults;
  return;
}

Assistant:

Parser()
      : _start(nullptr),
        _size(0),
        _pos(0),
        _nesting(0),
        options(&Options::Defaults) {
    _builder = std::make_shared<Builder>();
    _builderPtr = _builder.get();
    _builderPtr->options = &Options::Defaults;
  }